

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O3

MetadataPointer __thiscall
duckdb::MetadataManager::FromDiskPointer(MetadataManager *this,MetaBlockPointer pointer)

{
  iterator iVar1;
  InternalException *this_00;
  ulong params_2;
  block_id_t block_id;
  ulong local_48;
  string local_40;
  
  params_2 = pointer.block_pointer;
  local_48 = params_2 & 0xffffffffffffff;
  iVar1 = ::std::
          _Hashtable<long,_std::pair<const_long,_duckdb::MetadataBlock>,_std::allocator<std::pair<const_long,_duckdb::MetadataBlock>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->blocks)._M_h,(key_type_conflict2 *)&local_48);
  if (iVar1.super__Node_iterator_base<std::pair<const_long,_duckdb::MetadataBlock>,_false>._M_cur !=
      (__node_type *)0x0) {
    return (MetadataPointer)(params_2 & 0xff00000000000000 | local_48 & 0xffffffffffffff);
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Failed to load metadata pointer (id %llu, idx %llu, ptr %llu)\n",
             "");
  InternalException::InternalException<long,unsigned_int,unsigned_long>
            (this_00,&local_40,local_48,(uint)pointer.block_pointer._7_1_,params_2);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

MetadataPointer MetadataManager::FromDiskPointer(MetaBlockPointer pointer) {
	auto block_id = pointer.GetBlockId();
	auto index = pointer.GetBlockIndex();
	auto entry = blocks.find(block_id);
	if (entry == blocks.end()) { // LCOV_EXCL_START
		throw InternalException("Failed to load metadata pointer (id %llu, idx %llu, ptr %llu)\n", block_id, index,
		                        pointer.block_pointer);
	} // LCOV_EXCL_STOP
	MetadataPointer result;
	result.block_index = UnsafeNumericCast<idx_t>(block_id);
	result.index = UnsafeNumericCast<uint8_t>(index);
	return result;
}